

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O1

void Fossilize::remove_extension(char **active_extensions,size_t *out_extension_count,char *ext)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar3 = *out_extension_count;
  if (sVar3 != 0) {
    sVar4 = 0;
    do {
      iVar2 = strcmp(active_extensions[sVar4],ext);
      if (iVar2 == 0) {
        lVar1 = sVar3 - 1;
        sVar3 = sVar3 - 1;
        active_extensions[sVar4] = active_extensions[lVar1];
        break;
      }
      sVar4 = sVar4 + 1;
    } while (sVar3 != sVar4);
  }
  *out_extension_count = sVar3;
  return;
}

Assistant:

static void remove_extension(const char **active_extensions, size_t *out_extension_count, const char *ext)
{
	size_t count = *out_extension_count;
	for (size_t i = 0; i < count; i++)
	{
		if (strcmp(active_extensions[i], ext) == 0)
		{
			active_extensions[i] = active_extensions[--count];
			break;
		}
	}

	*out_extension_count = count;
}